

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

Function * __thiscall runtime::Heap::NewFunction(Heap *this)

{
  Function *local_18;
  Function *ret;
  
  local_18 = (Function *)operator_new(0x30);
  (local_18->scopeOuter).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18->fn = (Function *)0x0;
  (local_18->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_18->scopeOuter).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (local_18->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_18->captures).
  super__Vector_base<runtime::ClosureContext,_std::allocator<runtime::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::list<runtime::Function_*,_std::allocator<runtime::Function_*>_>::push_back
            (&this->createdFunctions,&local_18);
  return local_18;
}

Assistant:

runtime::Function* runtime::Heap::NewFunction() noexcept {
  auto ret = new runtime::Function{};
  this->createdFunctions.push_back(ret);
  return ret;
}